

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O1

void nn_sipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type == -3 && src == -2) goto LAB_0012cc79;
  while (*(int *)&self[1].fn != 7) {
    nn_sipc_shutdown_cold_2();
LAB_0012cc79:
    nn_sipc_shutdown_cold_1();
  }
  nn_sipc_shutdown_cold_3();
  return;
}

Assistant:

static void nn_sipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_pipebase_stop (&sipc->pipebase);
        nn_streamhdr_stop (&sipc->streamhdr);
        sipc->state = NN_SIPC_STATE_STOPPING;
    }
    if (nn_slow (sipc->state == NN_SIPC_STATE_STOPPING)) {
        if (nn_streamhdr_isidle (&sipc->streamhdr)) {
            nn_usock_swap_owner (sipc->usock, &sipc->usock_owner);
            sipc->usock = NULL;
            sipc->usock_owner.src = -1;
            sipc->usock_owner.fsm = NULL;
            sipc->state = NN_SIPC_STATE_IDLE;
            nn_fsm_stopped (&sipc->fsm, NN_SIPC_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state(sipc->state, src, type);
}